

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

bool baryonyx::itm::
     affect<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
               (solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                *slv,bit_array *x,row_value *it,int k,int selected,int r_size,float kappa,
               float delta)

{
  float fVar1;
  float *pfVar2;
  rc_data *prVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_00001204 [60];
  undefined1 in_register_00001244 [12];
  
  pfVar2 = (slv->pi)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  fVar1 = pfVar2[k];
  auVar11._4_12_ = in_register_00001204._0_12_;
  if (selected < 0) {
    uVar9 = 0;
    auVar12._0_4_ = kappa / (1.0 - kappa);
    auVar12._4_12_ = auVar11._4_12_;
    auVar6._4_12_ = in_register_00001244;
    auVar6._0_4_ = delta;
    auVar11 = vfmadd213ss_fma(ZEXT416((uint)(((slv->R)._M_t.
                                              super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                                              .
                                              super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
                                             ._M_head_impl)->value * 0.5)),auVar12,auVar6);
    for (; (uint)r_size != uVar9; uVar9 = uVar9 + 1) {
      iVar8 = (slv->R)._M_t.
              super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
              .
              super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
              ._M_head_impl[uVar9].id;
      bit_array_impl::unset(&x->super_bit_array_impl,it[iVar8].column);
      pfVar2 = (slv->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      pfVar2[it[iVar8].value] = pfVar2[it[iVar8].value] - auVar11._0_4_;
    }
  }
  else if ((int)(selected + 1U) < r_size) {
    prVar3 = (slv->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
             ._M_head_impl;
    uVar9 = (ulong)(selected + 1U);
    uVar10 = 0;
    pfVar2[k] = fVar1 + (prVar3[(uint)selected].value + prVar3[uVar9].value) * 0.5;
    auVar11._0_4_ = kappa / (1.0 - kappa);
    auVar4._4_12_ = in_register_00001244;
    auVar4._0_4_ = delta;
    auVar11 = vfmadd213ss_fma(ZEXT416((uint)(prVar3[uVar9].value - prVar3[(uint)selected].value)),
                              auVar11,auVar4);
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      iVar8 = (slv->R)._M_t.
              super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
              .
              super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
              ._M_head_impl[uVar10].id;
      bit_array_impl::set(&x->super_bit_array_impl,it[iVar8].column);
      pfVar2 = (slv->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      pfVar2[it[iVar8].value] = auVar11._0_4_ + pfVar2[it[iVar8].value];
    }
    for (; (uint)r_size != uVar9; uVar9 = uVar9 + 1) {
      iVar8 = (slv->R)._M_t.
              super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
              .
              super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
              ._M_head_impl[uVar9].id;
      bit_array_impl::unset(&x->super_bit_array_impl,it[iVar8].column);
      pfVar2 = (slv->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      pfVar2[it[iVar8].value] = pfVar2[it[iVar8].value] - auVar11._0_4_;
    }
  }
  else {
    uVar9 = 0;
    auVar13._0_4_ = kappa / (1.0 - kappa);
    auVar13._4_12_ = auVar11._4_12_;
    auVar5._4_12_ = in_register_00001244;
    auVar5._0_4_ = delta;
    auVar11 = vfmadd213ss_fma(ZEXT416((uint)((slv->R)._M_t.
                                             super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
                                             ._M_head_impl[(uint)selected].value * 1.5)),auVar13,
                              auVar5);
    for (; (uint)r_size != uVar9; uVar9 = uVar9 + 1) {
      iVar8 = (slv->R)._M_t.
              super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
              .
              super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
              ._M_head_impl[uVar9].id;
      bit_array_impl::set(&x->super_bit_array_impl,it[iVar8].column);
      pfVar2 = (slv->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      pfVar2[it[iVar8].value] = auVar11._0_4_ + pfVar2[it[iVar8].value];
    }
  }
  bVar7 = is_valid_constraint<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>,baryonyx::bit_array>
                    (slv,k,x);
  if (bVar7) {
    iVar8 = vmovmskps_avx(ZEXT416((uint)fVar1));
    return (bool)((byte)((byte)((uint)(iVar8 << 0x1f) >> 0x18) ^
                        (byte)((uint)(slv->pi)._M_t.
                                     super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                     super__Head_base<0UL,_float_*,_false>._M_head_impl[k] >> 0x18))
                 >> 7);
  }
  details::fail_fast("Precondition","is_valid_constraint(slv, k, x)",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                     ,"464");
}

Assistant:

bool
affect(Solver& slv,
       Xtype& x,
       Iterator it,
       int k,
       int selected,
       int r_size,
       const Float kappa,
       const Float delta)
{
    constexpr Float one{ 1 };
    constexpr Float two{ 2 };
    constexpr Float middle{ (two + one) / two };

    const auto old_pi = slv.pi[k];

    auto d = delta;

    if (selected < 0) {
        // slv.pi[k] += slv.R[0].value / two;
        d += (kappa / (one - kappa)) * (slv.R[0].value / two);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    } else if (selected + 1 >= r_size) {
        // slv.pi[k] += slv.R[selected].value * middle;
        d += (kappa / (one - kappa)) * (slv.R[selected].value * middle);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }
    } else {
        slv.pi[k] +=
          ((slv.R[selected].value + slv.R[selected + 1].value) / two);
        d += (kappa / (one - kappa)) *
             (slv.R[selected + 1].value - slv.R[selected].value);

        int i = 0;
        for (; i <= selected; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }

        for (; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    }

    // TODO job: develops is_valid_constraint for all the solvers
    bx_expects(is_valid_constraint(slv, k, x));

    return is_signbit_change(old_pi, slv.pi[k]);
}